

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderArrow(ImVec2 p_min,ImGuiDir dir,float scale)

{
  ImDrawList *this;
  ImGuiContext *pIVar1;
  ImU32 col;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_30;
  ImVec2 center;
  float r;
  float h;
  ImGuiContext *g;
  float scale_local;
  ImGuiDir dir_local;
  ImVec2 p_min_local;
  
  pIVar1 = GImGui;
  center.y = GImGui->FontSize;
  center.x = center.y * 0.4 * scale;
  _scale_local = p_min;
  ImVec2::ImVec2(&a,center.y * 0.5,center.y * 0.5 * scale);
  local_30 = operator+((ImVec2 *)&scale_local,&a);
  ImVec2::ImVec2(&b);
  ImVec2::ImVec2(&c);
  ImVec2::ImVec2(&local_50);
  if (dir == -1) {
LAB_0011049c:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0x9a5,"void ImGui::RenderArrow(ImVec2, ImGuiDir, float)");
  }
  if ((uint)dir < 2) {
    if (dir == 0) {
      center.x = -center.x;
    }
    ImVec2::ImVec2(&local_90,0.75,0.0);
    local_88 = ::operator*(&local_90,center.x);
    b = local_88;
    ImVec2::ImVec2(&local_a0,-0.75,0.866);
    local_98 = ::operator*(&local_a0,center.x);
    c = local_98;
    ImVec2::ImVec2(&local_b0,-0.75,-0.866);
    local_a8 = ::operator*(&local_b0,center.x);
    local_50 = local_a8;
  }
  else if (dir - 2U < 2) {
    if (dir == 2) {
      center.x = -center.x;
    }
    ImVec2::ImVec2(&local_60,0.0,0.75);
    local_58 = ::operator*(&local_60,center.x);
    b = local_58;
    ImVec2::ImVec2(&local_70,-0.866,-0.75);
    local_68 = ::operator*(&local_70,center.x);
    c = local_68;
    ImVec2::ImVec2(&local_80,0.866,-0.75);
    local_78 = ::operator*(&local_80,center.x);
    local_50 = local_78;
  }
  else if (dir == 4) goto LAB_0011049c;
  this = pIVar1->CurrentWindow->DrawList;
  local_b8 = operator+(&local_30,&b);
  local_c0 = operator+(&local_30,&c);
  local_c8 = operator+(&local_30,&local_50);
  col = GetColorU32(0,1.0);
  ImDrawList::AddTriangleFilled(this,&local_b8,&local_c0,&local_c8,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImVec2 p_min, ImGuiDir dir, float scale)
{
    ImGuiContext& g = *GImGui;

    const float h = g.FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f,+0.750f) * r;
        b = ImVec2(-0.866f,-0.750f) * r;
        c = ImVec2(+0.866f,-0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f,+0.000f) * r;
        b = ImVec2(-0.750f,+0.866f) * r;
        c = ImVec2(-0.750f,-0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }

    g.CurrentWindow->DrawList->AddTriangleFilled(center + a, center + b, center + c, GetColorU32(ImGuiCol_Text));
}